

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim2.c
# Opt level: O0

int Gia_Sim2HashKey(uint *pSim,int nWords,int nTableSize)

{
  uint local_20;
  uint local_1c;
  int i;
  uint uHash;
  int nTableSize_local;
  int nWords_local;
  uint *pSim_local;
  
  local_1c = 0;
  if ((*pSim & 1) == 0) {
    for (local_20 = 0; (int)local_20 < nWords; local_20 = local_20 + 1) {
      local_1c = pSim[(int)local_20] * Gia_Sim2HashKey::s_Primes[(int)(local_20 & 0xf)] ^ local_1c;
    }
  }
  else {
    for (local_20 = 0; (int)local_20 < nWords; local_20 = local_20 + 1) {
      local_1c = (pSim[(int)local_20] ^ 0xffffffff) *
                 Gia_Sim2HashKey::s_Primes[(int)(local_20 & 0xf)] ^ local_1c;
    }
  }
  return local_1c % (uint)nTableSize;
}

Assistant:

int Gia_Sim2HashKey( unsigned * pSim, int nWords, int nTableSize )
{
    static int s_Primes[16] = { 
        1291, 1699, 1999, 2357, 2953, 3313, 3907, 4177, 
        4831, 5147, 5647, 6343, 6899, 7103, 7873, 8147 };
    unsigned uHash = 0;
    int i;
    if ( pSim[0] & 1 )
        for ( i = 0; i < nWords; i++ )
            uHash ^= ~pSim[i] * s_Primes[i & 0xf];
    else
        for ( i = 0; i < nWords; i++ )
            uHash ^= pSim[i] * s_Primes[i & 0xf];
    return (int)(uHash % nTableSize);

}